

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeBuilder.cpp
# Opt level: O3

Shape * OpenMD::ShapeBuilder::internalCreateShape(Atom *atom)

{
  AtomType *this;
  RealType RVar1;
  bool bVar2;
  int atomicnum;
  Sphere *this_00;
  Vector3d *pVVar3;
  uint i;
  long lVar4;
  undefined1 *puVar5;
  pointer ppAVar6;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  LennardJonesAdapter lja;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_e8;
  LennardJonesAdapter local_d0;
  string local_c8;
  long *local_a8 [2];
  long local_98 [2];
  AtomType **local_88 [2];
  AtomType *local_78 [2];
  Vector3d local_68;
  Vector3d local_48;
  
  this = atom->atomType_;
  local_d0.at_ = this;
  bVar2 = LennardJonesAdapter::isLennardJones(&local_d0);
  if (bVar2) {
    this_00 = (Sphere *)operator_new(0x48);
    pVVar3 = (Vector3d *)
             ((long)(atom->super_StuntDouble).localIndex_ * 0x18 +
             *(long *)((long)&(((atom->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                              .position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (atom->super_StuntDouble).storage_));
    local_48.super_Vector<double,_3U>.data_[0] = 0.0;
    local_48.super_Vector<double,_3U>.data_[1] = 0.0;
    local_48.super_Vector<double,_3U>.data_[2] = 0.0;
    if (pVVar3 != &local_48) {
      lVar4 = 0;
      do {
        local_48.super_Vector<double,_3U>.data_[lVar4] =
             (pVVar3->super_Vector<double,_3U>).data_[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    RVar1 = LennardJonesAdapter::getSigma(&local_d0);
    Sphere::Sphere(this_00,&local_48,RVar1 * 0.5);
    (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(local_88,atom);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Shape).name_);
    if (local_88[0] == local_78) {
      return &this_00->super_Shape;
    }
    puVar5 = (undefined1 *)((long)&local_78[0]->_vptr_AtomType + 1);
  }
  else {
    AtomType::allYourBase(&local_e8,this);
    if (local_e8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      ppAVar6 = local_e8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0017e621:
      AtomType::getName_abi_cxx11_(&local_c8,*ppAVar6);
      atomicnum = ElementsTable::GetAtomicNum((ElementsTable *)etab,local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (atomicnum == 0) goto code_r0x0017e657;
      this_00 = (Sphere *)operator_new(0x48);
      pVVar3 = (Vector3d *)
               ((long)(atom->super_StuntDouble).localIndex_ * 0x18 +
               *(long *)((long)&(((atom->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (atom->super_StuntDouble).storage_));
      local_68.super_Vector<double,_3U>.data_[0] = 0.0;
      local_68.super_Vector<double,_3U>.data_[1] = 0.0;
      local_68.super_Vector<double,_3U>.data_[2] = 0.0;
      if (pVVar3 != &local_68) {
        lVar4 = 0;
        do {
          local_68.super_Vector<double,_3U>.data_[lVar4] =
               (pVVar3->super_Vector<double,_3U>).data_[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
      }
      RVar1 = ElementsTable::GetVdwRad((ElementsTable *)etab,atomicnum);
      Sphere::Sphere(this_00,&local_68,RVar1);
      (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(local_a8,atom);
      std::__cxx11::string::_M_assign((string *)&(this_00->super_Shape).name_);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      goto LAB_0017e763;
    }
LAB_0017e662:
    builtin_strncpy(painCave.errMsg + 0x20,"ult element.txt\n",0x11);
    builtin_strncpy(painCave.errMsg + 0x10,"tom type in defa",0x10);
    builtin_strncpy(painCave.errMsg,"Could not find a",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    this_00 = (Sphere *)0x0;
LAB_0017e763:
    if (local_e8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start == (AtomType **)0x0) {
      return &this_00->super_Shape;
    }
    puVar5 = (undefined1 *)
             ((long)local_e8.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_e8.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_start);
    local_88[0] = local_e8.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  operator_delete(local_88[0],(ulong)puVar5);
  return &this_00->super_Shape;
code_r0x0017e657:
  ppAVar6 = ppAVar6 + 1;
  if (ppAVar6 ==
      local_e8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0017e662;
  goto LAB_0017e621;
}

Assistant:

Shape* ShapeBuilder::internalCreateShape(Atom* atom) {
    AtomType* atomType      = atom->getAtomType();
    Shape* currShape        = NULL;
    LennardJonesAdapter lja = LennardJonesAdapter(atomType);
    if (lja.isLennardJones()) {
      currShape = new Sphere(atom->getPos(), lja.getSigma() / 2.0);
      currShape->setName(atom->getType());
    } else {
      int obanum(0);
      std::vector<AtomType*> atChain = atomType->allYourBase();
      std::vector<AtomType*>::iterator i;
      for (i = atChain.begin(); i != atChain.end(); ++i) {
        obanum = etab.GetAtomicNum((*i)->getName().c_str());
        if (obanum != 0) {
          currShape = new Sphere(atom->getPos(), etab.GetVdwRad(obanum));
          currShape->setName(atom->getType());
          break;
        }
      }
      if (obanum == 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not find atom type in default element.txt\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return currShape;
  }